

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  ImVector<ImGuiPopupData> *this;
  int i;
  uint uVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiContext_conflict1 *pIVar3;
  _Bool _Var4;
  uint *puVar5;
  ImGuiPopupData *pIVar6;
  ImVec2 *mouse_pos;
  ImGuiPopupData local_68;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  i = (GImGui->BeginPopupStack).Size;
  if (((popup_flags & 0x20U) != 0) && (_Var4 = IsPopupOpen(0,0x80), _Var4)) {
    return;
  }
  local_68.Window = (ImGuiWindow *)0x0;
  local_68.OpenPopupPos.x = 0.0;
  local_68.OpenPopupPos.y = 0.0;
  local_68.OpenMousePos.x = 0.0;
  local_68.OpenMousePos.y = 0.0;
  local_68._4_4_ = 0;
  local_68.PopupId = id;
  local_68.SourceWindow = (ImGuiWindow *)pIVar3->NavWindow;
  uVar1 = pIVar3->FrameCount;
  local_68.OpenParentId = 0;
  local_68.OpenFrameCount = uVar1;
  puVar5 = ImVector<unsigned_int>::back(&pIVar2->IDStack);
  local_68.OpenParentId = *puVar5;
  local_68.OpenPopupPos = NavCalcPreferredRefPos();
  mouse_pos = &(pIVar3->IO).MousePos;
  _Var4 = IsMousePosValid(mouse_pos);
  if (!_Var4) {
    mouse_pos = &local_68.OpenPopupPos;
  }
  local_68.OpenMousePos = *mouse_pos;
  this = &pIVar3->OpenPopupStack;
  if (i < (pIVar3->OpenPopupStack).Size) {
    pIVar6 = ImVector<ImGuiPopupData>::operator[](this,i);
    if ((pIVar6->PopupId == id) &&
       (pIVar6 = ImVector<ImGuiPopupData>::operator[](this,i),
       pIVar6->OpenFrameCount == pIVar3->FrameCount + -1)) {
      pIVar6 = ImVector<ImGuiPopupData>::operator[](this,i);
      pIVar6->OpenFrameCount = uVar1;
      return;
    }
    ClosePopupToLevel(i,false);
  }
  ImVector<ImGuiPopupData>::push_back(this,&local_68);
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}